

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::Add
          (EncodedDescriptorDatabase *this,void *encoded_file_descriptor,int size)

{
  bool bVar1;
  pointer this_00;
  LogMessage *pLVar2;
  Value value;
  pair<const_void_*,_int> pVar3;
  LogMessage local_168;
  Voidify local_155;
  undefined4 local_154;
  void *local_150;
  int local_148;
  void *local_140;
  int local_138;
  undefined1 local_120 [8];
  FileDescriptorProto file;
  void *pvStack_20;
  int size_local;
  void *encoded_file_descriptor_local;
  EncodedDescriptorDatabase *this_local;
  
  file.field_0._228_4_ = size;
  pvStack_20 = encoded_file_descriptor;
  encoded_file_descriptor_local = this;
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_120);
  bVar1 = MessageLite::ParseFromArray((MessageLite *)local_120,pvStack_20,file.field_0._228_4_);
  if (bVar1) {
    this_00 = std::
              unique_ptr<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex,_std::default_delete<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex>_>
              ::operator->(&this->index_);
    pVar3 = std::make_pair<void_const*&,int&>
                      (&stack0xffffffffffffffe0,(int *)((long)&file.field_0 + 0xe4));
    local_150 = pVar3.first;
    local_148 = pVar3.second;
    value._12_4_ = 0;
    value.first = (void *)SUB128(pVar3._0_12_,0);
    value.second = SUB124(pVar3._0_12_,8);
    local_140 = local_150;
    local_138 = local_148;
    this_local._7_1_ =
         DescriptorIndex::AddFile<google::protobuf::FileDescriptorProto>
                   (this_00,(FileDescriptorProto *)local_120,value);
  }
  else {
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              (&local_168,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database.cc"
               ,0x253);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_168);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [73])
                               "Invalid file descriptor data passed to EncodedDescriptorDatabase::Add()."
                       );
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_155,pLVar2);
    absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_168);
    this_local._7_1_ = false;
  }
  local_154 = 1;
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_120);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool EncodedDescriptorDatabase::Add(
    const void* PROTOBUF_NONNULL encoded_file_descriptor, int size) {
  FileDescriptorProto file;
  if (file.ParseFromArray(encoded_file_descriptor, size)) {
    return index_->AddFile(file, std::make_pair(encoded_file_descriptor, size));
  } else {
    ABSL_LOG(ERROR) << "Invalid file descriptor data passed to "
                       "EncodedDescriptorDatabase::Add().";
    return false;
  }
}